

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_map_with_map_boolean(void)

{
  size_type in_RCX;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar1;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_03;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_04;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_05;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_06;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_690;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_678;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_660;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_648;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_630;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_618;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_600;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_5e8;
  undefined1 local_5d9;
  int local_5d8;
  bool local_5d1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_5d0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_5c8;
  undefined1 local_568 [68];
  int local_524 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_518;
  undefined1 local_4b8 [77];
  undefined1 local_46b [2];
  undefined1 local_469;
  int local_468;
  bool local_461;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_460;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_458;
  undefined1 local_3f8 [68];
  int local_3b4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_3a8;
  undefined1 local_348 [77];
  undefined1 local_2fb [2];
  undefined1 local_2f9;
  int local_2f8;
  bool local_2f1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_2f0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_2e8;
  undefined1 local_288 [68];
  int local_244 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_238;
  undefined1 local_1d8 [77];
  undefined1 local_18b [2];
  undefined1 local_189;
  int local_188;
  bool local_181;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_180;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_178;
  undefined1 local_118 [84];
  int local_c4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_c0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_b8;
  undefined1 local_58 [78];
  undefined1 local_a [2];
  
  local_c0 = &local_b8;
  local_c4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_c0,(char (*) [6])"alpha",&local_c4);
  local_58._0_8_ = &local_b8;
  local_58._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10),
             (basic_map<std::allocator<char>_> *)local_58._0_8_,init);
  local_180 = &local_178;
  local_181 = true;
  local_188 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<bool,_int,_true>(local_180,&local_181,&local_188);
  local_118._0_8_ = &local_178;
  local_118._8_8_ = 1;
  init_00._M_len = in_RCX;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_118 + 0x10),
             (basic_map<std::allocator<char>_> *)local_118._0_8_,init_00);
  local_a[0] = trial::dynamic::operator<
                         ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10),
                          (basic_variable<std::allocator<char>_> *)(local_118 + 0x10));
  local_189 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{true, 1}})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f9f,"void relational_suite::compare_map_with_map_boolean()",local_a,&local_189);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_118 + 0x10));
  local_5e8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_118;
  do {
    local_5e8 = local_5e8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_5e8);
  } while (local_5e8 != &local_178);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10));
  ppVar1 = &local_b8;
  local_600 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_58;
  do {
    local_600 = local_600 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_600);
  } while (local_600 != ppVar1);
  local_244._4_8_ = &local_238;
  local_244[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_244._4_8_,(char (*) [6])"alpha",local_244);
  local_1d8._0_8_ = &local_238;
  local_1d8._8_8_ = 1;
  init_01._M_len = (size_type)ppVar1;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1d8._0_8_,init_01);
  local_2f0 = &local_2e8;
  local_2f1 = true;
  local_2f8 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<bool,_int,_true>(local_2f0,&local_2f1,&local_2f8);
  local_288._0_8_ = &local_2e8;
  local_288._8_8_ = 1;
  init_02._M_len = (size_type)ppVar1;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_288 + 0x10),
             (basic_map<std::allocator<char>_> *)local_288._0_8_,init_02);
  local_18b[0] = trial::dynamic::operator<=
                           ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_288 + 0x10));
  local_2f9 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) <= map::make({{true, 1}})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fa0,"void relational_suite::compare_map_with_map_boolean()",local_18b,&local_2f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_288 + 0x10));
  local_618 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_288;
  do {
    local_618 = local_618 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_618);
  } while (local_618 != &local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  ppVar1 = &local_238;
  local_630 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_1d8;
  do {
    local_630 = local_630 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_630);
  } while (local_630 != ppVar1);
  local_3b4._4_8_ = &local_3a8;
  local_3b4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_3b4._4_8_,(char (*) [6])"alpha",local_3b4);
  local_348._0_8_ = &local_3a8;
  local_348._8_8_ = 1;
  init_03._M_len = (size_type)ppVar1;
  init_03._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_348 + 0x10),
             (basic_map<std::allocator<char>_> *)local_348._0_8_,init_03);
  local_460 = &local_458;
  local_461 = true;
  local_468 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<bool,_int,_true>(local_460,&local_461,&local_468);
  local_3f8._0_8_ = &local_458;
  local_3f8._8_8_ = 1;
  init_04._M_len = (size_type)ppVar1;
  init_04._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_3f8._0_8_,init_04);
  local_2fb[0] = trial::dynamic::operator>
                           ((basic_variable<std::allocator<char>_> *)(local_348 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10));
  local_469 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) > map::make({{true, 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fa1,"void relational_suite::compare_map_with_map_boolean()",local_2fb,&local_469);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10));
  local_648 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_3f8;
  do {
    local_648 = local_648 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_648);
  } while (local_648 != &local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_348 + 0x10));
  ppVar1 = &local_3a8;
  local_660 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_348;
  do {
    local_660 = local_660 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_660);
  } while (local_660 != ppVar1);
  local_524._4_8_ = &local_518;
  local_524[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_524._4_8_,(char (*) [6])"alpha",local_524);
  local_4b8._0_8_ = &local_518;
  local_4b8._8_8_ = 1;
  init_05._M_len = (size_type)ppVar1;
  init_05._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_4b8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_4b8._0_8_,init_05);
  local_5d0 = &local_5c8;
  local_5d1 = true;
  local_5d8 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<bool,_int,_true>(local_5d0,&local_5d1,&local_5d8);
  local_568._0_8_ = &local_5c8;
  local_568._8_8_ = 1;
  init_06._M_len = (size_type)ppVar1;
  init_06._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_568 + 0x10),
             (basic_map<std::allocator<char>_> *)local_568._0_8_,init_06);
  local_46b[0] = trial::dynamic::operator>=
                           ((basic_variable<std::allocator<char>_> *)(local_4b8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_568 + 0x10));
  local_5d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) >= map::make({{true, 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fa2,"void relational_suite::compare_map_with_map_boolean()",local_46b,&local_5d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_568 + 0x10));
  local_678 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_568;
  do {
    local_678 = local_678 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_678);
  } while (local_678 != &local_5c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_4b8 + 0x10));
  local_690 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_4b8;
  do {
    local_690 = local_690 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_690);
  } while (local_690 != &local_518);
  return;
}

Assistant:

void compare_map_with_map_boolean()
{
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{true, 1}}), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) <= map::make({{true, 1}}), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) > map::make({{true, 1}}), true);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) >= map::make({{true, 1}}), true);
}